

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_lload_2(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value VVar1;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::getLocalVariableValue(this_01,3);
  if (VVar1.type != PADDING) {
    __assert_fail("value.type == ValueType::PADDING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x2db,"void ExecutionEngine::i_lload_2()");
  }
  Frame::pushIntoOperandStack(this_01,VVar1);
  VVar1 = Frame::getLocalVariableValue(this_01,2);
  if ((VVar1._0_8_ & 0xffffffff00000000) == 0x600000000) {
    Frame::pushIntoOperandStack(this_01,VVar1);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::LONG",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x2df,"void ExecutionEngine::i_lload_2()");
}

Assistant:

void ExecutionEngine::i_lload_2() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value;

    value = topFrame->getLocalVariableValue(3);
    assert(value.type == ValueType::PADDING);
    topFrame->pushIntoOperandStack(value);

    value = topFrame->getLocalVariableValue(2);
    assert(value.type == ValueType::LONG);
    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}